

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O1

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,Point2 *pred,Point2 *corr)

{
  int32_t *t;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  undefined8 *in_RCX;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar2 = *(undefined8 *)(corr->v_)._M_elems;
  iVar4 = pred[2].v_._M_elems[0];
  iVar8 = (int)uVar2 - iVar4;
  *(ulong *)(corr->v_)._M_elems = CONCAT44((int)((ulong)uVar2 >> 0x20) - iVar4,iVar8);
  iVar10 = (corr->v_)._M_elems[1];
  iVar7 = -iVar8;
  if (0 < iVar8) {
    iVar7 = iVar8;
  }
  iVar8 = -iVar10;
  if (0 < iVar10) {
    iVar8 = iVar10;
  }
  uVar5 = pred[2].v_._M_elems[0];
  if (uVar5 < (uint)(iVar8 + iVar7)) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)corr,(corr->v_)._M_elems + 1);
  }
  uVar2 = *(undefined8 *)(corr->v_)._M_elems;
  iVar9 = (int)*in_RCX + (int)uVar2;
  iVar10 = (int)((ulong)*in_RCX >> 0x20) + (int)((ulong)uVar2 >> 0x20);
  uVar6 = CONCAT44(iVar10,iVar9);
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = iVar9;
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  max_quantized_value_ = iVar10;
  iVar10 = pred[2].v_._M_elems[0];
  if (iVar10 < iVar9) {
    uVar6 = (ulong)(uint)(iVar9 - (pred->v_)._M_elems[1]);
  }
  else if (SBORROW4(iVar9,-iVar10) != iVar9 + iVar10 < 0) {
    uVar6 = (ulong)(uint)(iVar9 + (pred->v_)._M_elems[1]);
  }
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = (int32_t)uVar6;
  t = &(this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
       max_quantized_value_;
  iVar9 = (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
          max_quantized_value_;
  if (iVar10 < iVar9) {
    iVar9 = iVar9 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar9,-iVar10) != iVar9 + iVar10 < 0) {
    iVar9 = iVar9 + (pred->v_)._M_elems[1];
  }
  *t = iVar9;
  if (uVar5 < (uint)(iVar8 + iVar7)) {
    OctahedronToolBox::InvertDiamond((OctahedronToolBox *)pred,(int32_t *)this,t);
  }
  uVar1 = (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
          quantization_bits_;
  uVar3 = (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
          max_quantized_value_;
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = iVar4 + uVar1;
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  max_quantized_value_ = iVar4 + uVar3;
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, const Point2 &corr) const {
    const Point2 t(this->center_value(), this->center_value());
    typedef typename std::make_unsigned<DataTypeT>::type UnsignedDataTypeT;
    typedef VectorD<UnsignedDataTypeT, 2> Point2u;

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    pred = Point2(Point2u(pred) - Point2u(t));

    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    Point2 orig(Point2u(pred) + Point2u(corr));

    orig[0] = this->ModMax(orig[0]);
    orig[1] = this->ModMax(orig[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    orig = Point2(Point2u(orig) + Point2u(t));
    return orig;
  }